

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall
Js::PolymorphicInlineCache::CacheAccessor
          (PolymorphicInlineCache *this,bool isGetter,PropertyId propertyId,
          PropertyIndex propertyIndex,bool isInlineSlot,Type *type,DynamicObject *object,
          bool isOnProto,ScriptContext *requestContext)

{
  ushort uVar1;
  Type pIVar2;
  Type *pTVar3;
  Type *pTVar4;
  bool bVar5;
  PropertyRecord *pPVar6;
  ulong uVar7;
  uint inlineCacheIndex;
  ulong uVar8;
  
  uVar8 = (ulong)this->size + 0xffffffff & (ulong)type >> 6;
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,CloneCacheInCollisionPhase);
  inlineCacheIndex = (uint)uVar8;
  if (!bVar5) {
    pIVar2 = this->inlineCaches;
    uVar7 = uVar8 & 0xffffffff;
    pTVar3 = pIVar2[uVar7].u.local.type;
    if (pTVar3 != (Type *)0x0) {
      uVar1 = *(ushort *)((long)&pIVar2[uVar7].u + 0x10);
      pTVar4 = pIVar2[uVar7].u.local.typeWithoutProperty;
      if (((((byte)uVar1 & pTVar4 != (Type *)0x0) == 0) && (((uint)pTVar4 & 0xd) != 0xd)) &&
         (this->size != 1)) {
        if ((uVar1 & 1) == 0) {
          if (((ulong)pTVar3 & 1) == 0) {
            CloneInlineCacheToEmptySlotInCollision<false,false,true>(this,type,inlineCacheIndex);
          }
          else {
            CloneInlineCacheToEmptySlotInCollision<false,true,false>(this,type,inlineCacheIndex);
          }
        }
        else {
          CloneInlineCacheToEmptySlotInCollision<true,false,false>(this,type,inlineCacheIndex);
        }
      }
    }
  }
  InlineCache::CacheAccessor
            (this->inlineCaches + (uVar8 & 0xffffffff),isGetter,propertyId,propertyIndex,
             isInlineSlot,type,object,isOnProto,requestContext);
  UpdateInlineCachesFillInfo(this,inlineCacheIndex,true);
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015b6718,PolymorphicInlineCachePhase);
  if ((bVar5) && (DAT_015bc46a == '\x01')) {
    pPVar6 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"PIC::CacheAccessor, %s, %d: ",pPVar6 + 1,uVar8 & 0xffffffff);
    InlineCache::Dump(this->inlineCaches + (uVar8 & 0xffffffff));
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CacheAccessor(
        const bool isGetter,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        Type *const type,
        DynamicObject *const object,
        const bool isOnProto,
        ScriptContext *const requestContext)
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
#if INTRUSIVE_TESTTRACE_PolymorphicInlineCache
        bool collision = !inlineCaches[inlineCacheIndex].IsEmpty();
#endif
        if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
        {
            if (!inlineCaches[inlineCacheIndex].IsEmpty() && !inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
            {
                if (inlineCaches[inlineCacheIndex].IsLocal())
                {
                    CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                }
                else if (inlineCaches[inlineCacheIndex].IsProto())
                {
                    CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                }
                else
                {
                    CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                }
            }
        }

        inlineCaches[inlineCacheIndex].CacheAccessor(isGetter, propertyId, propertyIndex, isInlineSlot, type, object, isOnProto, requestContext);
        UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("PIC::CacheAccessor, %s, %d: "), requestContext->GetPropertyName(propertyId)->GetBuffer(), inlineCacheIndex);
            inlineCaches[inlineCacheIndex].Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
        PHASE_PRINT_INTRUSIVE_TESTTRACE1(
            Js::PolymorphicInlineCachePhase,
            _u("TestTrace PIC: CacheAccessor, 0x%x, entryIndex = %d, collision = %s, entries = %d\n"), this, inlineCacheIndex, collision ? _u("true") : _u("false"), GetEntryCount());
    }